

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O2

QList<int> * __thiscall
QListViewPrivate::hiddenRowIds(QList<int> *__return_storage_ptr__,QListViewPrivate *this)

{
  Data *pDVar1;
  parameter_type t;
  size_t asize;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  pDVar1 = (this->hiddenRows).q_hash.d;
  if (pDVar1 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar1->size;
  }
  QList<int>::reserve(__return_storage_ptr__,asize);
  local_28 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin(&(this->hiddenRows).q_hash)
  ;
  while( true ) {
    if (local_28.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
        local_28.bucket == 0) break;
    t = QPersistentModelIndex::row();
    QList<int>::append(__return_storage_ptr__,t);
    QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::operator++
              (&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> hiddenRowIds() const
    {
        QList<int> rowIds;
        rowIds.reserve(hiddenRows.size());
        for (const auto &idx : hiddenRows)
            rowIds += idx.row();
        return rowIds;
    }